

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControlContainer::~ControlContainer(ControlContainer *this)

{
  Data *pDVar1;
  QObject *pQVar2;
  
  *(undefined ***)this = &PTR_metaObject_007d0378;
  removeButtonsFromMenuBar(this,(QMenuBar *)0x0);
  pDVar1 = (this->m_menuLabel).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (this->m_menuLabel).wp.value, pQVar2 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QWeakPointer<QObject>::assign<QObject>(&(this->m_menuLabel).wp,(QObject *)0x0);
  pDVar1 = (this->m_controllerWidget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (this->m_controllerWidget).wp.value, pQVar2 != (QObject *)0x0)) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  QWeakPointer<QObject>::assign<QObject>(&(this->m_controllerWidget).wp,(QObject *)0x0);
  QWeakPointer<QObject>::~QWeakPointer(&(this->mdiChild).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_menuLabel).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_controllerWidget).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->m_menuBar).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->previousRight).wp);
  QWeakPointer<QObject>::~QWeakPointer(&(this->previousLeft).wp);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

ControlContainer::~ControlContainer()
{
#if QT_CONFIG(menubar)
    removeButtonsFromMenuBar();
#endif
    delete m_menuLabel;
    m_menuLabel = nullptr;
    delete m_controllerWidget;
    m_controllerWidget = nullptr;
}